

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O3

float trng::math::detail::GammaPQ_asympt_R<float>(float a,float eta,float eta_squard_half)

{
  size_t i;
  long lVar1;
  float fVar2;
  float fVar3;
  float in_XMM0_Dc;
  uint in_XMM0_Dd;
  float y_old;
  float fVar4;
  float fStack_40;
  uint uStack_3c;
  float afStack_38 [14];
  
  afStack_38[9] = 8.2967114e-07;
  afStack_38[10] = -1.7665953e-07;
  lVar1 = 10;
  do {
    (&fStack_40)[lVar1] =
         ((float)lVar1 * afStack_38[lVar1]) / a + *(float *)(&UNK_002a812c + lVar1 * 4);
    lVar1 = lVar1 + -1;
  } while (lVar1 != 1);
  fVar2 = 1.0;
  lVar1 = 0;
  fVar3 = 0.0;
  do {
    fVar4 = afStack_38[lVar1] * fVar2 + fVar3;
    if ((fVar4 == fVar3) && (!NAN(fVar4) && !NAN(fVar3))) break;
    fVar2 = fVar2 * eta;
    lVar1 = lVar1 + 1;
    fVar3 = fVar4;
  } while (lVar1 != 0xb);
  fStack_40 = -in_XMM0_Dc;
  uStack_3c = in_XMM0_Dd ^ 0x80000000;
  fVar3 = expf(eta_squard_half * -a);
  if (a < -a) {
    fVar2 = sqrtf(a);
  }
  else {
    fVar2 = SQRT(a);
  }
  return ((fVar3 * (fVar4 / (afStack_38[1] / a + 1.0))) / fVar2) * 0.3989423;
}

Assistant:

TRNG_CUDA_ENABLE T GammaPQ_asympt_R(T a, T eta, T eta_squard_half) {
        GammaPQ_asympt_coefficients<T> coeffs;
        constexpr std::size_t n{coeffs.max_index() - 1};
        T beta[n];
        beta[n - 1] = coeffs.get(n);
        beta[n - 2] = coeffs.get(n - 1);
        for (std::ptrdiff_t i{n - 3}; i >= 0; --i)
          beta[i] = beta[i + 2] * (i + 2) / a + coeffs.get(i + 1);
        T eta_to_the_i{1};
        T y{0};
        for (std::size_t i{0}; i < n; ++i) {
          const T y_old{y};
          y += beta[i] * eta_to_the_i;
          if (y == y_old)
            break;
          eta_to_the_i *= eta;
        }
        return y / (1 + beta[1] / a) * exp(-a * eta_squard_half) / sqrt(a) *
               constants<T>::one_over_sqrt_2pi;
      }